

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O1

void Hop_ObjDelete(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                  ,0xbc,"void Hop_ObjDelete(Hop_Man_t *, Hop_Obj_t *)");
  }
  uVar1 = *(uint *)&pObj->field_0x20;
  if (((uVar1 & 6) != 2) && ((uVar1 & 7) != 1)) {
    if (0x3f < uVar1) {
      __assert_fail("Hop_ObjRefs(pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                    ,0xbe,"void Hop_ObjDelete(Hop_Man_t *, Hop_Obj_t *)");
    }
    p->nObjs[uVar1 & 7] = p->nObjs[uVar1 & 7] + -1;
    p->nDeleted = p->nDeleted + 1;
    Hop_ObjDisconnect(p,pObj);
    if ((*(uint *)&pObj->field_0x20 & 7) == 2) {
      pVVar2 = p->vPis;
      uVar1 = pVVar2->nSize;
      lVar5 = (ulong)uVar1 + 1;
      do {
        if ((int)lVar5 + -1 < 1) {
          __assert_fail("i >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x304,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
        }
        lVar4 = lVar5 + -1;
        lVar3 = lVar5 + -2;
        lVar5 = lVar4;
      } while ((Hop_Obj_t *)pVVar2->pArray[lVar3] != pObj);
      for (; (int)lVar4 < (int)uVar1; lVar4 = lVar4 + 1) {
        pVVar2->pArray[lVar4 + -1] = pVVar2->pArray[lVar4];
      }
      pVVar2->nSize = uVar1 - 1;
    }
    pObj->field_0x20 = pObj->field_0x20 & 0xf8;
    pObj->field_0 = (anon_union_8_2_00a17ec8_for_Hop_Obj_t__0)p->pListFree;
    p->pListFree = pObj;
    return;
  }
  __assert_fail("!Hop_ObjIsTerm(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                ,0xbd,"void Hop_ObjDelete(Hop_Man_t *, Hop_Obj_t *)");
}

Assistant:

void Hop_ObjDelete( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    assert( !Hop_ObjIsTerm(pObj) );
    assert( Hop_ObjRefs(pObj) == 0 );
    // update node counters of the manager
    p->nObjs[pObj->Type]--;
    p->nDeleted++;
    // remove connections
    Hop_ObjDisconnect( p, pObj );
    // remove PIs/POs from the arrays
    if ( Hop_ObjIsPi(pObj) )
        Vec_PtrRemove( p->vPis, pObj );
    // free the node
    Hop_ManRecycleMemory( p, pObj );
}